

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O3

int __thiscall deqp::egl::GetConfigAttribCase::init(GetConfigAttribCase *this,EVP_PKEY_CTX *ctx)

{
  pointer ppvVar1;
  pointer ppvVar2;
  TestContext *this_00;
  int extraout_EAX;
  EGLDisplay pvVar3;
  Library *egl;
  vector<void_*,_std::allocator<void_*>_> local_28;
  
  pvVar3 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_display = pvVar3;
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  eglu::getConfigs(&local_28,egl,this->m_display);
  ppvVar1 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar2 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (ppvVar1 != (pointer)0x0) {
    operator_delete(ppvVar1,(long)ppvVar2 - (long)ppvVar1);
    if (local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  (this->m_configsIter)._M_current =
       (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
  return extraout_EAX;
}

Assistant:

void GetConfigAttribCase::init (void)
{
	DE_ASSERT(m_display == EGL_NO_DISPLAY);
	m_display		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_configs		= eglu::getConfigs(m_eglTestCtx.getLibrary(), m_display);
	m_configsIter	= m_configs.begin();

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}